

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

Section * scommon_section(GlobalVars *gv,ObjectUnit *ou)

{
  Section *pSVar1;
  
  if (ou->scommon != (Section *)0x0) {
    return ou->scommon;
  }
  pSVar1 = add_section(ou,gv->scommon_sec_name,(uint8_t *)0x0,0,'\x03','\x03','\x03','\0',1);
  if (ou->common != (Section *)0x0) {
    pSVar1->alignment = ou->common->alignment;
  }
  ou->scommon = pSVar1;
  return pSVar1;
}

Assistant:

struct Section *scommon_section(struct GlobalVars *gv,struct ObjectUnit *ou)
/* returns the dummy section for small-data COMMON symbols, or creates it */
{
  struct Section *s;

  if (!(s = ou->scommon)) {
    s = add_section(ou,gv->scommon_sec_name,NULL,0,ST_UDATA,
                    SF_ALLOC|SF_UNINITIALIZED,SP_READ|SP_WRITE,0,TRUE);
    if (ou->common)
      s->alignment = ou->common->alignment;  /* inherit .common alignment */
    ou->scommon = s;
  }
  return s;
}